

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_symbols.cxx
# Opt level: O0

void draw_filesave(Fl_Color c)

{
  Fl_Color FVar1;
  Fl_Color c_local;
  
  fl_color(c);
  fl_begin_polygon();
  fl_vertex(-0.9,-1.0);
  fl_vertex(0.9,-1.0);
  fl_vertex(1.0,-0.9);
  fl_vertex(1.0,0.9);
  fl_vertex(0.9,1.0);
  fl_vertex(-0.9,1.0);
  fl_vertex(-1.0,0.9);
  fl_vertex(-1.0,-0.9);
  fl_end_polygon();
  FVar1 = fl_lighter(c);
  fl_color(FVar1);
  fl_begin_polygon();
  fl_vertex(-0.7,-1.0);
  fl_vertex(0.7,-1.0);
  fl_vertex(0.7,-0.4);
  fl_vertex(-0.7,-0.4);
  fl_end_polygon();
  fl_begin_polygon();
  fl_vertex(-0.7,0.0);
  fl_vertex(0.7,0.0);
  fl_vertex(0.7,1.0);
  fl_vertex(-0.7,1.0);
  fl_end_polygon();
  fl_color(c);
  fl_begin_polygon();
  fl_vertex(-0.5,-0.9);
  fl_vertex(-0.3,-0.9);
  fl_vertex(-0.3,-0.5);
  fl_vertex(-0.5,-0.5);
  fl_end_polygon();
  FVar1 = fl_darker(c);
  fl_color(FVar1);
  fl_begin_loop();
  fl_vertex(-0.9,-1.0);
  fl_vertex(0.9,-1.0);
  fl_vertex(1.0,-0.9);
  fl_vertex(1.0,0.9);
  fl_vertex(0.9,1.0);
  fl_vertex(-0.9,1.0);
  fl_vertex(-1.0,0.9);
  fl_vertex(-1.0,-0.9);
  fl_end_loop();
  return;
}

Assistant:

static void draw_filesave(Fl_Color c) {
  fl_color(c);
  BP;
    vv(-0.9, -1.0);
    vv(0.9, -1.0);
    vv(1.0, -0.9);
    vv(1.0, 0.9);
    vv(0.9, 1.0);
    vv(-0.9, 1.0);
    vv(-1.0, 0.9);
    vv(-1.0, -0.9);
  EP;

  fl_color(fl_lighter(c));
  BP;
    vv(-0.7, -1.0);
    vv(0.7, -1.0);
    vv(0.7, -0.4);
    vv(-0.7, -0.4);
  EP;

  BP;
    vv(-0.7, 0.0);
    vv(0.7, 0.0);
    vv(0.7, 1.0);
    vv(-0.7, 1.0);
  EP;

  fl_color(c);
  BP;
    vv(-0.5, -0.9);
    vv(-0.3, -0.9);
    vv(-0.3, -0.5);
    vv(-0.5, -0.5);
  EP;

  fl_color(fl_darker(c));
  BC;
    vv(-0.9, -1.0);
    vv(0.9, -1.0);
    vv(1.0, -0.9);
    vv(1.0, 0.9);
    vv(0.9, 1.0);
    vv(-0.9, 1.0);
    vv(-1.0, 0.9);
    vv(-1.0, -0.9);
  EC;
}